

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slice.h
# Opt level: O1

uint8_t * __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
valueStart(SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this)

{
  byte bVar1;
  uint uVar2;
  byte bVar3;
  byte *pbVar4;
  
  bVar3 = 0;
  pbVar4 = *(byte **)this;
  do {
    bVar1 = *pbVar4;
    if ((bVar1 & 0xfe) != 0xee) break;
    uVar2 = (uint)(bVar1 == 0xef) * 9;
    if (bVar1 == 0xee) {
      uVar2 = 2;
    }
    bVar3 = bVar3 + (char)uVar2;
    pbVar4 = pbVar4 + uVar2;
  } while (uVar2 != 0);
  return *(byte **)this + bVar3;
}

Assistant:

uint8_t const* getDataPtr() const noexcept { return _start; }